

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_hs_psk(mbedtls_ssl_context *ssl,uchar *psk,size_t psk_len)

{
  uchar *puVar1;
  size_t psk_len_local;
  uchar *psk_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((psk == (uchar *)0x0) || (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
    ssl_local._4_4_ = -0x7100;
  }
  else if (psk_len < 0x21) {
    if (ssl->handshake->psk != (uchar *)0x0) {
      free(ssl->handshake->psk);
    }
    puVar1 = (uchar *)calloc(1,psk_len);
    ssl->handshake->psk = puVar1;
    if (puVar1 == (uchar *)0x0) {
      ssl_local._4_4_ = -0x7f00;
    }
    else {
      ssl->handshake->psk_len = psk_len;
      memcpy(ssl->handshake->psk,psk,ssl->handshake->psk_len);
      ssl_local._4_4_ = 0;
    }
  }
  else {
    ssl_local._4_4_ = -0x7100;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_hs_psk( mbedtls_ssl_context *ssl,
                            const unsigned char *psk, size_t psk_len )
{
    if( psk == NULL || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( psk_len > MBEDTLS_PSK_MAX_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( ssl->handshake->psk != NULL )
        mbedtls_free( ssl->handshake->psk );

    if( ( ssl->handshake->psk = mbedtls_calloc( 1, psk_len ) ) == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    ssl->handshake->psk_len = psk_len;
    memcpy( ssl->handshake->psk, psk, ssl->handshake->psk_len );

    return( 0 );
}